

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_textedit.h
# Opt level: O3

int ImGuiStb::stb_text_locate_coord(ImGuiTextEditState *str,float x,float y)

{
  unsigned_short *puVar1;
  ulong uVar2;
  int iVar3;
  ImWchar *text;
  undefined1 in_R8B;
  ulong uVar4;
  int iVar5;
  int line_start_idx;
  float fVar6;
  ImVec2 IVar7;
  float fVar8;
  int local_48;
  ImWchar *local_38;
  
  iVar3 = str->CurLenW;
  if (iVar3 < 1) {
    return iVar3;
  }
  uVar4 = 0;
  fVar8 = 0.0;
  while( true ) {
    puVar1 = (str->Text).Data;
    local_38 = (ImWchar *)0x0;
    line_start_idx = (int)uVar4;
    IVar7 = InputTextCalcTextSizeW
                      (puVar1 + line_start_idx,puVar1 + str->CurLenW,&local_38,(ImVec2 *)0x1,
                       (bool)in_R8B);
    uVar2 = (ulong)((long)local_38 - (long)(puVar1 + line_start_idx)) >> 1;
    local_48 = (int)uVar2;
    if (local_48 < 1) {
      return iVar3;
    }
    if ((line_start_idx == 0) && (y < fVar8)) {
      return 0;
    }
    fVar8 = fVar8 + IVar7.y;
    if (y < fVar8) break;
    uVar4 = (ulong)(uint)(line_start_idx + local_48);
    if (iVar3 <= line_start_idx + local_48) {
      return iVar3;
    }
  }
  if (0.0 <= x) {
    if (x < IVar7.x) {
      uVar4 = (long)local_38 + (uVar4 * -2 - (long)puVar1);
      iVar5 = 0;
      iVar3 = 0;
      fVar8 = 0.0;
      do {
        fVar6 = STB_TEXTEDIT_GETWIDTH(str,line_start_idx,iVar3);
        if (x < fVar8 + fVar6) {
          uVar4 = (ulong)(uint)(line_start_idx - iVar5);
          if (fVar8 + fVar6 * 0.5 <= x) {
            uVar4 = (ulong)((line_start_idx - iVar5) + 1);
          }
          goto LAB_0013babd;
        }
        iVar3 = iVar3 + 1;
        iVar5 = iVar5 + -1;
        fVar8 = fVar8 + fVar6;
      } while (-(int)(uVar4 >> 1) != iVar5);
      uVar4 = uVar2 & 0xffffffff;
    }
    local_48 = (int)uVar4 + local_48;
    if (local_48 <= (str->Text).Size) {
      if ((str->Text).Data[(long)local_48 + -1] == 10) {
        local_48 = local_48 + -1;
      }
      return local_48;
    }
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                  ,0x35c,
                  "const value_type &ImVector<unsigned short>::operator[](int) const [T = unsigned short]"
                 );
  }
LAB_0013babd:
  return (int)uVar4;
}

Assistant:

static int stb_text_locate_coord(STB_TEXTEDIT_STRING *str, float x, float y)
{
   StbTexteditRow r;
   int n = STB_TEXTEDIT_STRINGLEN(str);
   float base_y = 0, prev_x;
   int i=0, k;

   r.x0 = r.x1 = 0;
   r.ymin = r.ymax = 0;
   r.num_chars = 0;

   // search rows to find one that straddles 'y'
   while (i < n) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (r.num_chars <= 0)
         return n;

      if (i==0 && y < base_y + r.ymin)
         return 0;

      if (y < base_y + r.ymax)
         break;

      i += r.num_chars;
      base_y += r.baseline_y_delta;
   }

   // below all text, return 'after' last character
   if (i >= n)
      return n;

   // check if it's before the beginning of the line
   if (x < r.x0)
      return i;

   // check if it's before the end of the line
   if (x < r.x1) {
      // search characters in row for one that straddles 'x'
      k = i;
      prev_x = r.x0;
      for (i=0; i < r.num_chars; ++i) {
         float w = STB_TEXTEDIT_GETWIDTH(str, k, i);
         if (x < prev_x+w) {
            if (x < prev_x+w/2)
               return k+i;
            else
               return k+i+1;
         }
         prev_x += w;
      }
      // shouldn't happen, but if it does, fall through to end-of-line case
   }

   // if the last character is a newline, return that. otherwise return 'after' the last character
   if (STB_TEXTEDIT_GETCHAR(str, i+r.num_chars-1) == STB_TEXTEDIT_NEWLINE)
      return i+r.num_chars-1;
   else
      return i+r.num_chars;
}